

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DICEPS.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ostream *poVar2;
  time_t tVar3;
  undefined8 uVar4;
  long lVar5;
  DICEPSPlanner *this;
  type pJVar6;
  undefined8 in_RSI;
  undefined4 in_EDI;
  double dVar7;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar8 [16];
  undefined1 extraout_var [56];
  E *e;
  char formvalue [10];
  double V;
  clock_t stime;
  clock_t utime;
  clock_t ticks;
  clock_t ticks_after;
  clock_t ticks_before;
  tms ts_after;
  tms ts_before;
  Index restartI;
  double total_value;
  clock_t total_utime_diceps;
  DICEPSPlanner *planner;
  PlanningUnitMADPDiscreteParameters params;
  stringstream ss;
  ofstream conv_of;
  ofstream of;
  string convergenceFilename;
  string timingsFilename;
  string filename;
  DecPOMDPDiscreteInterface *decpomdp;
  Timing Time;
  int horizon;
  Arguments args;
  char *in_stack_fffffffffffff280;
  undefined4 in_stack_fffffffffffff288;
  undefined4 in_stack_fffffffffffff28c;
  allocator<char> *in_stack_fffffffffffff290;
  char *in_stack_fffffffffffff298;
  allocator<char> *__s;
  Arguments *in_stack_fffffffffffff2a0;
  allocator<char> local_b39;
  string local_b38 [38];
  char local_b12 [10];
  shared_ptr<JointPolicyPureVector> local_b08 [16];
  double local_af8;
  long local_af0;
  long local_ae8;
  long local_ae0;
  allocator<char> local_ad1;
  string local_ad0 [39];
  allocator<char> local_aa9;
  string local_aa8 [32];
  clock_t local_a88;
  clock_t local_a80;
  tms local_a78;
  tms local_a58;
  uint local_a34;
  double local_a30;
  long local_a28;
  allocator<char> local_a19;
  string local_a18 [32];
  DICEPSPlanner *local_9f8;
  PlanningUnitMADPDiscreteParameters local_9ea [9];
  allocator<char> local_9e1;
  string local_9e0 [32];
  string local_9c0 [36];
  int local_99c;
  string local_998 [32];
  string local_978 [32];
  string local_958 [39];
  allocator<char> local_931;
  string local_930 [39];
  allocator<char> local_909;
  MultiAgentDecisionProcessInterface local_908 [32];
  string local_8e8 [32];
  stringstream local_8c8 [16];
  ostream local_8b8 [376];
  ofstream local_740 [512];
  long local_540 [64];
  allocator<char> local_339;
  string local_338 [39];
  allocator<char> local_311;
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [32];
  DecPOMDPDiscreteInterface *local_2c8;
  allocator<char> local_2b9;
  string local_2b8 [32];
  Timing local_298 [56];
  int local_260;
  Arguments local_250;
  undefined8 local_18;
  undefined4 local_10;
  int local_c;
  undefined1 auVar10 [64];
  undefined1 auVar9 [16];
  
  local_c = 0;
  local_18 = in_RSI;
  local_10 = in_EDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"DICE: direct CE Policy Search");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"-----------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  ArgumentHandlers::Arguments::Arguments(in_stack_fffffffffffff2a0);
  argp_parse(ArgumentHandlers::theArgpStruc,local_10,local_18,0,0,&local_250);
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  local_260 = local_250.horizon;
  poVar2 = std::operator<<((ostream *)&std::cout,"Horizon = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_260);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Timing::Timing(local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290);
  Timing::Start((string *)local_298);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  local_2c8 = (DecPOMDPDiscreteInterface *)
              ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&local_250);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290);
  std::allocator<char>::~allocator(&local_339);
  std::ofstream::ofstream(local_540);
  std::ofstream::ofstream(local_740);
  std::__cxx11::stringstream::stringstream(local_8c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290);
  directories::MADPGetResultsFilename
            (local_8e8,local_908,(Arguments *)(local_2c8 + *(long *)(*(long *)local_2c8 + -0x40)));
  poVar2 = std::operator<<(local_8b8,local_8e8);
  poVar2 = std::operator<<(poVar2,"h");
  std::ostream::operator<<(poVar2,local_260);
  std::__cxx11::string::~string(local_8e8);
  std::__cxx11::string::~string((string *)local_908);
  std::allocator<char>::~allocator(&local_909);
  poVar2 = std::operator<<(local_8b8,"_CEr");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_250.nrCERestarts);
  poVar2 = std::operator<<(poVar2,"_i");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_250.nrCEIterations);
  poVar2 = std::operator<<(poVar2,"_s");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_250.nrCESamples);
  poVar2 = std::operator<<(poVar2,"_sfu");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_250.nrCESamplesForUpdate);
  poVar2 = std::operator<<(poVar2,"_a");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_250.CE_alpha);
  poVar2 = std::operator<<(poVar2,"_ht");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(bool)(local_250.CE_use_hard_threshold & 1));
  poVar2 = std::operator<<(poVar2,"_evals");
  std::ostream::operator<<(poVar2,local_250.nrCEEvaluationRuns);
  if (local_250.dryrun == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290);
    directories::MADPCreateResultsDir
              (local_930,
               (MultiAgentDecisionProcessInterface *)
               (local_2c8 + *(long *)(*(long *)local_2c8 + -0x40)));
    std::__cxx11::string::~string(local_930);
    std::allocator<char>::~allocator(&local_931);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=(local_2e8,local_958);
    std::__cxx11::string::~string(local_958);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),
                   in_stack_fffffffffffff280);
    std::__cxx11::string::operator=(local_310,local_978);
    std::__cxx11::string::~string(local_978);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),
                   in_stack_fffffffffffff280);
    std::__cxx11::string::operator=(local_338,local_998);
    std::__cxx11::string::~string(local_998);
  }
  uVar4 = std::__cxx11::string::c_str();
  std::ofstream::open(local_540,uVar4,0x10);
  bVar1 = std::ios::operator!((ios *)((long)local_540 + *(long *)(local_540[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Computing ");
    std::__cxx11::stringstream::str();
    poVar2 = std::operator<<(poVar2,local_9c0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_9c0);
    poVar2 = std::operator<<((ostream *)local_540,"#horiz.");
    std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<((ostream *)local_540,"value     ");
    std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<((ostream *)local_540,"wctime");
    std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<((ostream *)local_540,"utime ");
    std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<((ostream *)local_540,"stime ");
    std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<((ostream *)local_540,"found jpol index\t(1tick=1/");
    lVar5 = sysconf(2);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar5);
    std::operator<<(poVar2,"s)\n");
    std::ostream::flush();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290);
    Timing::Start((string *)local_298);
    std::__cxx11::string::~string(local_9e0);
    std::allocator<char>::~allocator(&local_9e1);
    PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_9ea);
    PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(local_9ea,0));
    PlanningUnitMADPDiscreteParameters::SetComputeJointActionObservationHistories(local_9ea,false);
    PlanningUnitMADPDiscreteParameters::SetComputeJointActionHistories(local_9ea,false);
    PlanningUnitMADPDiscreteParameters::SetComputeIndividualActionObservationHistories
              (local_9ea,false);
    PlanningUnitMADPDiscreteParameters::SetComputeIndividualActionHistories(local_9ea,false);
    PlanningUnitMADPDiscreteParameters::SetComputeJointObservationHistories(local_9ea,true);
    PlanningUnitMADPDiscreteParameters::SetComputeJointBeliefs(local_9ea,false);
    if (local_250.sparse == 0) {
      PlanningUnitMADPDiscreteParameters::SetUseSparseJointBeliefs(local_9ea,false);
    }
    else {
      PlanningUnitMADPDiscreteParameters::SetUseSparseJointBeliefs(local_9ea,true);
    }
    this = (DICEPSPlanner *)operator_new(0x3b0);
    DICEPSPlanner::DICEPSPlanner
              (this,(long)local_260,local_2c8,1,local_250.nrCEIterations,local_250.nrCESamples,
               local_250.nrCESamplesForUpdate,(bool)(local_250.CE_use_hard_threshold & 1),
               local_250.CE_alpha,local_250.nrCEEvaluationRuns,local_9ea,false,local_740,
               local_250.verbose);
    local_9f8 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290);
    Timing::Stop((string *)local_298);
    std::__cxx11::string::~string(local_a18);
    std::allocator<char>::~allocator(&local_a19);
    poVar2 = std::operator<<((ostream *)&std::cout,"DICEPSPlanner initialized");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_a28 = 0;
    local_a30 = 0.0;
    for (local_a34 = 0; local_a34 < local_250.nrCERestarts; local_a34 = local_a34 + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290);
      Timing::Start((string *)local_298);
      std::__cxx11::string::~string(local_aa8);
      std::allocator<char>::~allocator(&local_aa9);
      local_a80 = times(&local_a58);
      (**(code **)(*(long *)local_9f8 + 0x18))();
      local_a88 = times(&local_a78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff290);
      Timing::Stop((string *)local_298);
      std::__cxx11::string::~string(local_ad0);
      std::allocator<char>::~allocator(&local_ad1);
      local_ae0 = local_a88 - local_a80;
      local_ae8 = local_a78.tms_utime - local_a58.tms_utime;
      local_af0 = local_a78.tms_stime - local_a58.tms_stime;
      local_a28 = local_a28 + local_ae8;
      local_af8 = (double)(**(code **)(*(long *)local_9f8 + 0x98))();
      if (-1 < local_250.verbose) {
        poVar2 = std::operator<<((ostream *)&std::cout,"value=");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_af8);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        if (local_250.verbose != 0) {
          (**(code **)(*(long *)local_9f8 + 0xa0))(local_b08);
          pJVar6 = boost::shared_ptr<JointPolicyPureVector>::operator->(local_b08);
          (**(code **)(*(long *)pJVar6 + 0x38))();
          boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
                    ((shared_ptr<JointPolicyPureVector> *)0x105271);
          std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        }
      }
      local_a30 = local_a30 + local_af8;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_540,local_260);
      std::operator<<(poVar2,"\t");
      sprintf(local_b12,"%.6f",local_af8);
      poVar2 = std::operator<<((ostream *)local_540,local_b12);
      std::operator<<(poVar2,"\t");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_540,local_ae0);
      std::operator<<(poVar2,"\t");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_540,local_ae8);
      std::operator<<(poVar2,"\t");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_540,local_af0);
      std::operator<<(poVar2,"\t");
      std::operator<<((ostream *)local_540,"-1\n");
      std::ostream::flush();
      if ((ulong)local_a34 == local_250.nrCERestarts - 1) {
        poVar2 = std::operator<<((ostream *)local_540,"# h ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_250.horizon);
        uVar4 = extraout_XMM1_Qb;
        poVar2 = std::operator<<(poVar2,"\t");
        poVar2 = std::operator<<(poVar2," avg DICEPS time (s): ");
        dVar7 = (double)local_a28;
        lVar5 = sysconf(2);
        auVar8._0_8_ = (double)lVar5;
        auVar8._8_8_ = uVar4;
        auVar9 = vcvtusi2sd_avx512f(auVar8,local_250.nrCERestarts);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(dVar7 / auVar8._0_8_) / auVar9._0_8_);
        auVar10._8_56_ = extraout_var;
        auVar10._0_8_ = extraout_XMM1_Qa;
        auVar9 = auVar10._0_16_;
        poVar2 = std::operator<<(poVar2," avg value: ");
        auVar9 = vcvtusi2sd_avx512f(auVar9,local_250.nrCERestarts);
        in_stack_fffffffffffff2a0 =
             (Arguments *)std::ostream::operator<<(poVar2,local_a30 / auVar9._0_8_);
        std::ostream::operator<<
                  ((ostream *)in_stack_fffffffffffff2a0,std::endl<char,std::char_traits<char>>);
      }
    }
    __s = &local_b39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff2a0,(char *)__s,in_stack_fffffffffffff290);
    Timing::Stop((string *)local_298);
    std::__cxx11::string::~string(local_b38);
    std::allocator<char>::~allocator(&local_b39);
    if (-1 < local_250.verbose) {
      Timing::PrintSummary();
      TimedAlgorithm::PrintTimersSummary();
    }
    if (local_9f8 != (DICEPSPlanner *)0x0) {
      (**(code **)(*(long *)local_9f8 + 8))();
    }
    PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_9ea);
    local_99c = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"could not open ");
    poVar2 = std::operator<<(poVar2,local_2e8);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_c = 1;
    local_99c = 1;
  }
  std::__cxx11::stringstream::~stringstream(local_8c8);
  std::ofstream::~ofstream(local_740);
  std::ofstream::~ofstream(local_540);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string(local_310);
  std::__cxx11::string::~string(local_2e8);
  Timing::~Timing(local_298);
  if (local_99c == 0) {
    local_99c = 0;
  }
  ArgumentHandlers::Arguments::~Arguments((Arguments *)0x1058a4);
  return local_c;
}

Assistant:

int main(int argc, char **argv)
{
    cout << "DICE: direct CE Policy Search"<<endl;
    cout << "-----------------------------"<<endl;
    // parse the command line arguments
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    srand(time(0));


    int horizon = args.horizon;
    cout << "Horizon = " << horizon << endl;


    try {
    //start timers
    Timing Time;    
    Time.Start("Overall");

    DecPOMDPDiscreteInterface & decpomdp = * GetDecPOMDPDiscreteInterfaceFromArgs(args);

    // setup the output file stream 
    string filename="/dev/null",timingsFilename="/dev/null", 
           convergenceFilename="/dev/null";
    ofstream of, conv_of;
    stringstream ss;
    ss << directories::MADPGetResultsFilename("DICEPS",decpomdp,args)
        << "h" << horizon;
    // add the CE parameters into the output file name
    ss  << "_CEr" << args.nrCERestarts 
        << "_i" << args.nrCEIterations
        << "_s" << args.nrCESamples 
        << "_sfu" << args.nrCESamplesForUpdate
        << "_a" << args.CE_alpha 
        << "_ht" << args.CE_use_hard_threshold
        << "_evals" << args.nrCEEvaluationRuns;
    if(!args.dryrun)
    {
        directories::MADPCreateResultsDir("DICEPS",decpomdp);
        filename=ss.str();
        timingsFilename=filename + "_Timings";
        convergenceFilename=filename + "_convergence";
    }
    of.open(filename.c_str());
    if(!of)
    {
        cerr << "could not open " << filename << endl;
        return(1);
    }
    cout << "Computing " << ss.str() << endl;
    //write headers
    of << "#horiz."<<"\t";
    of << "value     " <<"\t";
    of << "wctime"<< "\t";
    of << "utime " <<"\t";
    of << "stime " <<"\t";
    of << "found jpol index\t(1tick=1/"<<sysconf(_SC_CLK_TCK)<<"s)\n";
    of.flush();
    
    //Initialization of the planner with typical options for JESP:
    Time.Start("PlanningUnit");
    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(true);
    params.SetComputeJointActionObservationHistories(false);
    params.SetComputeJointActionHistories(false);
    params.SetComputeIndividualActionObservationHistories(false);
    params.SetComputeIndividualActionHistories(false);
    //params.SetComputeIndividualObservationHistories(false);
    // joint observations histories are needed for
    // efficient computation of joint actions
    params.SetComputeJointObservationHistories(true);
    params.SetComputeJointBeliefs(false);
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);
    DICEPSPlanner* planner;
    planner = new DICEPSPlanner (
        horizon,
        &decpomdp,
        //CE params
        1, // the restarts loop is executed here, not in DICEPSPlanner
        args.nrCEIterations,
        args.nrCESamples,
        args.nrCESamplesForUpdate, 
        args.CE_use_hard_threshold, //(gamma in CE papers)
        args.CE_alpha, //the learning rate
        args.nrCEEvaluationRuns //the number of evaluation runs
        , &params
        , 
#if CONVERGENCE_STATS        
        true // convergence stats  
#else
        false        
#endif
        , &conv_of
        , args.verbose
    );
    Time.Stop("PlanningUnit");
    cout << "DICEPSPlanner initialized" << endl;

    clock_t total_utime_diceps=0;
    double total_value=0;
    for(Index restartI = 0; restartI < args.nrCERestarts; restartI++)
    {
        //start all timers:
        tms ts_before, ts_after;
        clock_t ticks_before, ticks_after;
        Time.Start("Plan");
        ticks_before = times(&ts_before);
        planner->Plan();
        //stop all timers
        ticks_after = times(&ts_after);
        Time.Stop("Plan");
        clock_t ticks =  ticks_after - ticks_before;
        clock_t utime =   ts_after.tms_utime - ts_before.tms_utime;
        clock_t stime =   ts_after.tms_stime - ts_before.tms_stime;

        total_utime_diceps+=utime;

        double V = planner->GetExpectedReward();
        if(args.verbose >= 0)
        {
            cout << "value="<< V << endl;
            if(args.verbose)        {
            planner->GetJointPolicyPureVector()->Print();
            cout <<  endl;
            }
        }
        total_value+=V;
        
        of << horizon<<"\t";
        char formvalue[10];
        sprintf(formvalue, "%.6f", V);
        of << formvalue <<"\t";
        of << ticks <<"\t";
        of << utime <<"\t";
        of << stime <<"\t";
        of << "-1\n";//Cannot get index of joint pol., since  "planner->GetJointPolicyPureVector()->GetIndex()" does not work
        of.flush();

        // output average statistics after completing the last restart
        if(restartI==(args.nrCERestarts-1))
            of << "# h " << args.horizon<<"\t"
               << " avg DICEPS time (s): "
               << (static_cast<double>(total_utime_diceps)/
                   sysconf(_SC_CLK_TCK))/args.nrCERestarts
               << " avg value: " << total_value/args.nrCERestarts
               << endl;
    }
    /* clean up */

    Time.Stop("Overall");

    if(args.verbose >= 0)
    {
        Time.PrintSummary();
        planner->PrintTimersSummary();
    }
#if 0
    if(//args.saveTimings && 
            !args.dryrun)
    {
        Time.Save(timingsFilename);
        planner->SaveTimers(timingsFilename);
    }
#endif
    delete planner;
    }
    catch(E& e){ e.Print(); }
}